

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.cpp
# Opt level: O2

void __thiscall
duckdb::CSVError::CSVError
          (CSVError *this,string *error_message_p,CSVErrorType type_p,LinesPerBoundary error_info_p)

{
  ::std::__cxx11::string::string((string *)this,(string *)error_message_p);
  (this->full_error_message)._M_dataplus._M_p = (pointer)&(this->full_error_message).field_2;
  (this->full_error_message)._M_string_length = 0;
  (this->full_error_message).field_2._M_local_buf[0] = '\0';
  this->type = type_p;
  this->column_idx = 0;
  (this->csv_row)._M_dataplus._M_p = (pointer)&(this->csv_row).field_2;
  (this->csv_row)._M_string_length = 0;
  (this->csv_row).field_2._M_local_buf[0] = '\0';
  (this->error_info).boundary_idx = error_info_p.boundary_idx;
  (this->error_info).lines_in_batch = error_info_p.lines_in_batch;
  this->row_byte_position = 0;
  (this->byte_position).index = 0xffffffffffffffff;
  return;
}

Assistant:

CSVError::CSVError(string error_message_p, CSVErrorType type_p, LinesPerBoundary error_info_p)
    : error_message(std::move(error_message_p)), type(type_p), error_info(error_info_p) {
}